

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O0

void __thiscall
hrvo::Agent::Agent(Agent *this,Simulator *simulator,Vector2 *position,size_t goalNo,
                  float neighborDist,size_t maxNeighbors,float radius,Vector2 *velocity,
                  float maxAccel,float goalRadius,float prefSpeed,float maxSpeed,float orientation,
                  float uncertaintyOffset)

{
  undefined8 in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM5_Da;
  undefined4 in_XMM6_Da;
  undefined4 in_XMM7_Da;
  
  *in_RDI = in_RSI;
  in_RDI[1] = *in_R9;
  in_RDI[2] = *in_RDX;
  Vector2::Vector2((Vector2 *)(in_RDI + 3));
  in_RDI[4] = *in_R9;
  in_RDI[5] = in_RCX;
  in_RDI[6] = in_R8;
  *(undefined4 *)(in_RDI + 7) = in_XMM3_Da;
  *(undefined4 *)((long)in_RDI + 0x3c) = in_XMM2_Da;
  *(undefined4 *)(in_RDI + 8) = in_XMM5_Da;
  *(undefined4 *)((long)in_RDI + 0x44) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 9) = in_XMM6_Da;
  *(undefined4 *)((long)in_RDI + 0x4c) = in_XMM4_Da;
  *(undefined4 *)(in_RDI + 10) = in_XMM1_Da;
  *(undefined4 *)((long)in_RDI + 0x54) = in_XMM7_Da;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  std::
  multimap<float,_hrvo::Agent::Candidate,_std::less<float>,_std::allocator<std::pair<const_float,_hrvo::Agent::Candidate>_>_>
  ::multimap((multimap<float,_hrvo::Agent::Candidate,_std::less<float>,_std::allocator<std::pair<const_float,_hrvo::Agent::Candidate>_>_>
              *)0x103a4b);
  std::
  set<std::pair<float,_unsigned_long>,_std::less<std::pair<float,_unsigned_long>_>,_std::allocator<std::pair<float,_unsigned_long>_>_>
  ::set((set<std::pair<float,_unsigned_long>,_std::less<std::pair<float,_unsigned_long>_>,_std::allocator<std::pair<float,_unsigned_long>_>_>
         *)0x103a61);
  std::vector<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>::vector
            ((vector<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>
              *)0x103a74);
  return;
}

Assistant:

Agent::Agent(Simulator *simulator, const Vector2 &position, std::size_t goalNo,
             float neighborDist, std::size_t maxNeighbors, float radius,
             const Vector2 &velocity, float maxAccel, float goalRadius,
             float prefSpeed, float maxSpeed, float orientation,
#if HRVO_DIFFERENTIAL_DRIVE
             float timeToOrientation, float wheelTrack,
#endif /* HRVO_DIFFERENTIAL_DRIVE */
             float uncertaintyOffset)
    : simulator_(simulator),
      newVelocity_(velocity),
      position_(position),
      velocity_(velocity),
      goalNo_(goalNo),
      maxNeighbors_(maxNeighbors),
      goalRadius_(goalRadius),
      maxAccel_(maxAccel),
      maxSpeed_(maxSpeed),
      neighborDist_(neighborDist),
      orientation_(orientation),
      prefSpeed_(prefSpeed),
      radius_(radius),
      uncertaintyOffset_(uncertaintyOffset),
#if HRVO_DIFFERENTIAL_DRIVE
      leftWheelSpeed_(0.0F),
      rightWheelSpeed_(0.0F),
      timeToOrientation_(timeToOrientation),
      wheelTrack_(wheelTrack),
#endif /* HRVO_DIFFERENTIAL_DRIVE */
      reachedGoal_(false) {
#if HRVO_DIFFERENTIAL_DRIVE
  computeWheelSpeeds();
#endif /* HRVO_DIFFERENTIAL_DRIVE */
}